

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

prpnum prssynp(prscxdef *ctx,uchar *prefix,size_t pfxlen,uchar *suffix)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  tokdef *tok_00;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  toktdef *tab;
  size_t suflen;
  toksdef sym;
  tokdef tok;
  undefined4 in_stack_ffffffffffffff40;
  prpnum in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff46;
  tokdef *in_stack_ffffffffffffff48;
  prscxdef *in_stack_ffffffffffffff50;
  char acStack_78 [40];
  undefined1 local_50 [48];
  void *local_20;
  size_t local_18;
  void *local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = osrp2(in_RCX);
  tok_00 = (tokdef *)(long)(iVar2 + -2);
  local_20 = (void *)((long)local_20 + 2);
  iVar2 = (int)local_18 + iVar2 + -2;
  memcpy(acStack_78,local_10,local_18);
  memcpy(acStack_78 + local_18,local_20,(size_t)tok_00);
  tok_case_fold((tokcxdef *)
                CONCAT26(in_stack_ffffffffffffff46,
                         CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),tok_00);
  acStack_78[iVar2] = '\0';
  uVar3 = tokhsh(acStack_78);
  lVar1 = *(long *)(local_8 + 0x10);
  local_50[0] = 0;
  (**(code **)(lVar1 + 8))(lVar1,acStack_78,iVar2,uVar3,local_50);
  prsdef(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
         CONCAT22(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44));
  (**(code **)(lVar1 + 8))(lVar1,acStack_78,iVar2,uVar3,&stack0xffffffffffffff42);
  return in_stack_ffffffffffffff44;
}

Assistant:

static prpnum prssynp(prscxdef *ctx, uchar *prefix, size_t pfxlen,
                      uchar *suffix)
{
    tokdef   tok;
    toksdef  sym;
    size_t   suflen;
    toktdef *tab;
    
    /* construct the token */
    suflen = osrp2(suffix) - 2;
    suffix += 2;

    /* build the synonym */
    tok.toklen = pfxlen + suflen;
    memcpy(tok.toknam, prefix, pfxlen);
    memcpy(tok.toknam + pfxlen, suffix, suflen);

    /* fold case if we're in case-insensitive mode */
    tok_case_fold(ctx->prscxtok, &tok);

    /* build the token */
    tok.toknam[tok.toklen] = '\0';
    tok.tokhash = tokhsh(tok.toknam);
    tok.toktyp = TOKTSYMBOL;

    /* look up the symbol, if it's already in the table */
    tab = ctx->prscxstab;
    tok.toksym.tokstyp = TOKSTUNK;
    (*tab->toktfsea)(tab, tok.toknam, tok.toklen, tok.tokhash, &tok.toksym);

    /* make it a property if it's not already */
    prsdef(ctx, &tok, TOKSTPROP);
    
    /* now look it up and return its property number */
    (*tab->toktfsea)(tab, tok.toknam, tok.toklen, tok.tokhash, &sym);
    return(sym.toksval);
}